

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_8.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_scan_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  byte *pbVar1;
  char *pcVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int8_t *ptr_06;
  long lVar12;
  uint uVar13;
  size_t len;
  long lVar14;
  uint uVar15;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ulong uVar16;
  int iVar17;
  int8_t iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  undefined1 uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  char cVar27;
  char cVar28;
  ulong uVar29;
  char cVar34;
  char cVar36;
  char cVar38;
  char cVar40;
  char cVar42;
  char cVar44;
  char cVar48;
  char cVar51;
  char cVar53;
  char cVar55;
  char cVar57;
  char cVar59;
  char cVar61;
  undefined1 auVar30 [16];
  char cVar35;
  char cVar37;
  char cVar39;
  char cVar41;
  char cVar43;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar49;
  char cVar52;
  char cVar54;
  char cVar56;
  char cVar58;
  char cVar60;
  char cVar62;
  char cVar63;
  char cVar64;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ulong uVar50;
  ulong uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  ulong uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ulong uVar82;
  byte bVar83;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  byte bVar101;
  undefined1 auVar86 [16];
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  byte bVar116;
  char cVar117;
  char cVar118;
  char cVar119;
  char cVar120;
  char cVar121;
  char cVar122;
  char cVar123;
  char cVar124;
  char cVar125;
  char cVar126;
  char cVar127;
  char cVar128;
  char cVar129;
  char cVar130;
  char cVar131;
  char cVar132;
  undefined1 auVar133 [16];
  char cVar134;
  byte bVar135;
  char cVar137;
  byte bVar138;
  char cVar139;
  byte bVar140;
  char cVar141;
  byte bVar142;
  char cVar143;
  byte bVar144;
  char cVar145;
  byte bVar146;
  char cVar147;
  byte bVar148;
  char cVar149;
  byte bVar150;
  char cVar151;
  byte bVar152;
  char cVar153;
  byte bVar154;
  char cVar155;
  byte bVar156;
  char cVar157;
  byte bVar158;
  char cVar159;
  byte bVar160;
  char cVar161;
  byte bVar162;
  char cVar163;
  byte bVar164;
  undefined1 auVar136 [16];
  char cVar165;
  byte bVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  byte bVar176;
  byte bVar177;
  byte bVar178;
  byte bVar179;
  byte bVar180;
  byte bVar181;
  byte bVar182;
  byte bVar183;
  byte bVar184;
  byte bVar185;
  byte bVar186;
  byte bVar187;
  byte bVar188;
  byte bVar189;
  byte bVar190;
  byte bVar191;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_8_t h;
  undefined1 local_228 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  byte local_138;
  byte bStack_137;
  byte bStack_136;
  byte bStack_135;
  byte bStack_134;
  byte bStack_133;
  byte bStack_132;
  byte bStack_131;
  byte bStack_130;
  byte bStack_12f;
  byte bStack_12e;
  byte bStack_12d;
  byte bStack_12c;
  byte bStack_12b;
  byte bStack_12a;
  byte bStack_129;
  byte local_b8;
  byte bStack_b7;
  byte bStack_b6;
  byte bStack_b5;
  byte bStack_b4;
  byte bStack_b3;
  byte bStack_b2;
  byte bStack_b1;
  byte bStack_b0;
  byte bStack_af;
  byte bStack_ae;
  byte bStack_ad;
  byte bStack_ac;
  byte bStack_ab;
  byte bStack_aa;
  byte bStack_a9;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_scan_profile_sse41_128_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_stats_scan_profile_sse41_128_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_scan_profile_sse41_128_8_cold_6();
      }
      else {
        uVar13 = profile->s1Len;
        if ((int)uVar13 < 1) {
          parasail_nw_stats_scan_profile_sse41_128_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_scan_profile_sse41_128_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_scan_profile_sse41_128_8_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_scan_profile_sse41_128_8_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_scan_profile_sse41_128_8_cold_1();
        }
        else {
          iVar17 = uVar13 - 1;
          uVar25 = (ulong)uVar13 + 0xf >> 4;
          uVar24 = (uint)uVar25;
          uVar26 = iVar17 % (int)uVar24;
          pvVar5 = (profile->profile8).matches;
          pvVar6 = (profile->profile8).similar;
          iVar20 = -open;
          iVar8 = ppVar4->min;
          local_1a8._0_4_ = iVar20;
          local_188._0_4_ = open;
          uVar13 = (uint)(byte)-(char)iVar8;
          if (iVar8 != iVar20 && SBORROW4(iVar8,iVar20) == iVar8 + open < 0) {
            uVar13 = open;
          }
          bVar7 = 0x7e - (char)ppVar4->max;
          local_198[0] = bVar7;
          ppVar11 = parasail_result_new_stats();
          if (ppVar11 != (parasail_result_t *)0x0) {
            ppVar11->flag = ppVar11->flag | 0x10110401;
            b = parasail_memalign___m128i(0x10,uVar25);
            b_00 = parasail_memalign___m128i(0x10,uVar25);
            b_01 = parasail_memalign___m128i(0x10,uVar25);
            b_02 = parasail_memalign___m128i(0x10,uVar25);
            ptr = parasail_memalign___m128i(0x10,uVar25);
            b_03 = parasail_memalign___m128i(0x10,uVar25);
            b_04 = parasail_memalign___m128i(0x10,uVar25);
            b_05 = parasail_memalign___m128i(0x10,uVar25);
            ptr_00 = parasail_memalign___m128i(0x10,uVar25);
            ptr_01 = parasail_memalign___m128i(0x10,uVar25);
            ptr_02 = parasail_memalign___m128i(0x10,uVar25);
            ptr_03 = parasail_memalign___m128i(0x10,uVar25);
            ptr_04 = parasail_memalign___m128i(0x10,uVar25);
            ptr_05 = parasail_memalign___m128i(0x10,uVar25);
            ptr_06 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
            c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            c[1]._0_1_ = (ptr_02 == (__m128i *)0x0 ||
                         (ptr_01 == (__m128i *)0x0 ||
                         (ptr_00 == (__m128i *)0x0 || b_05 == (__m128i *)0x0))) ||
                         ((b_04 == (__m128i *)0x0 ||
                          (b_03 == (__m128i *)0x0 || ptr == (__m128i *)0x0)) ||
                         ((b_02 == (__m128i *)0x0 || b_01 == (__m128i *)0x0) ||
                         (b_00 == (__m128i *)0x0 || b == (__m128i *)0x0)));
            if ((ptr_06 != (int8_t *)0x0 &&
                (ptr_05 != (__m128i *)0x0 && (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))
                ) && ((ptr_02 != (__m128i *)0x0 &&
                      (ptr_01 != (__m128i *)0x0 &&
                      (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0))) &&
                     ((b_04 != (__m128i *)0x0 && (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0))
                     && ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                        (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
              iVar8 = s2Len + -1;
              iVar9 = 0xf - iVar17 / (int)uVar24;
              auVar66 = pshufb(ZEXT416((uint)open),(undefined1  [16])0x0);
              len = (size_t)(uint)gap;
              auVar67 = pshufb(ZEXT416((uint)gap),(undefined1  [16])0x0);
              auVar78 = ZEXT116((byte)((char)uVar13 + 0x81));
              auVar68 = pshufb(auVar78,(undefined1  [16])0x0);
              auVar69 = pshufb(ZEXT116(bVar7),(undefined1  [16])0x0);
              auVar30 = pmovzxbq((undefined1  [16])0x0,0x80);
              auVar70 = pshufb(ZEXT416(uVar24),auVar30);
              auVar30 = pshufb(ZEXT116((byte)-(char)(uVar24 * gap)),auVar30);
              auVar71 = paddsb(auVar30,auVar78);
              c[0] = uVar25;
              parasail_memset___m128i(b_03,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = uVar25;
              parasail_memset___m128i(b_04,c_00,len);
              c_01[1] = extraout_RDX_01;
              c_01[0] = uVar25;
              parasail_memset___m128i(b_05,c_01,len);
              c_02[1] = extraout_RDX_02;
              c_02[0] = uVar25;
              parasail_memset___m128i(b,c_02,len);
              c_03[1] = extraout_RDX_03;
              c_03[0] = uVar25;
              parasail_memset___m128i(b_00,c_03,len);
              c_04[1] = extraout_RDX_04;
              c_04[0] = uVar25;
              parasail_memset___m128i(b_01,c_04,len);
              c_05[1] = extraout_RDX_05;
              c_05[0] = uVar25;
              parasail_memset___m128i(b_02,c_05,len);
              auVar30 = _DAT_008d0c20;
              auVar79 = psubsb((undefined1  [16])0x0,auVar66);
              uVar13 = uVar24 - 1;
              lVar12 = (ulong)uVar13 << 4;
              uVar16 = uVar25;
              auVar72 = _DAT_008d0c20;
              do {
                *(undefined1 (*) [16])((long)*ptr_04 + lVar12) = auVar79;
                *(undefined1 (*) [16])((long)*ptr_05 + lVar12) = auVar72;
                auVar79 = psubsb(auVar79,auVar67);
                auVar72 = paddsb(auVar72,auVar30);
                lVar12 = lVar12 + -0x10;
                iVar19 = (int)uVar16;
                uVar15 = iVar19 - 1;
                uVar16 = (ulong)uVar15;
              } while (uVar15 != 0 && 0 < iVar19);
              uVar16 = 0;
              iVar19 = iVar20;
              do {
                lVar12 = 0;
                iVar10 = iVar19;
                do {
                  uVar22 = 0x80;
                  if (-0x80 < iVar10) {
                    uVar22 = (undefined1)iVar10;
                  }
                  *(undefined1 *)((long)&local_48 + lVar12) = uVar22;
                  lVar12 = lVar12 + 1;
                  iVar10 = iVar10 - uVar24 * gap;
                } while (lVar12 != 0x10);
                ptr[uVar16][0] = local_48;
                ptr[uVar16][1] = lStack_40;
                uVar16 = uVar16 + 1;
                iVar19 = iVar19 - gap;
              } while (uVar16 != uVar25);
              *ptr_06 = '\0';
              uVar16 = 1;
              do {
                iVar18 = -0x80;
                if (-0x80 < iVar20) {
                  iVar18 = (int8_t)iVar20;
                }
                ptr_06[uVar16] = iVar18;
                uVar16 = uVar16 + 1;
                iVar20 = iVar20 - gap;
              } while (s2Len + 1 != uVar16);
              uVar16 = 1;
              if (1 < s2Len) {
                uVar16 = (ulong)(uint)s2Len;
              }
              lVar12 = (ulong)(uVar24 + (uVar24 == 0)) << 4;
              uVar21 = 0;
              local_138 = auVar68[0];
              bStack_137 = auVar68[1];
              bStack_136 = auVar68[2];
              bStack_135 = auVar68[3];
              bStack_134 = auVar68[4];
              bStack_133 = auVar68[5];
              bStack_132 = auVar68[6];
              bStack_131 = auVar68[7];
              bStack_130 = auVar68[8];
              bStack_12f = auVar68[9];
              bStack_12e = auVar68[10];
              bStack_12d = auVar68[0xb];
              bStack_12c = auVar68[0xc];
              bStack_12b = auVar68[0xd];
              bStack_12a = auVar68[0xe];
              bStack_129 = auVar68[0xf];
              local_b8 = auVar69[0];
              bStack_b7 = auVar69[1];
              bStack_b6 = auVar69[2];
              bStack_b5 = auVar69[3];
              bStack_b4 = auVar69[4];
              bStack_b3 = auVar69[5];
              bStack_b2 = auVar69[6];
              bStack_b1 = auVar69[7];
              bStack_b0 = auVar69[8];
              bStack_af = auVar69[9];
              bStack_ae = auVar69[10];
              bStack_ad = auVar69[0xb];
              bStack_ac = auVar69[0xc];
              bStack_ab = auVar69[0xd];
              bStack_aa = auVar69[0xe];
              bStack_a9 = auVar69[0xf];
              bVar7 = local_138;
              bVar102 = bStack_137;
              bVar103 = bStack_136;
              bVar104 = bStack_135;
              bVar105 = bStack_134;
              bVar106 = bStack_133;
              bVar107 = bStack_132;
              bVar108 = bStack_131;
              bVar109 = bStack_130;
              bVar110 = bStack_12f;
              bVar111 = bStack_12e;
              bVar112 = bStack_12d;
              bVar113 = bStack_12c;
              bVar114 = bStack_12b;
              bVar115 = bStack_12a;
              bVar116 = bStack_129;
              bVar176 = local_b8;
              bVar177 = bStack_b7;
              bVar178 = bStack_b6;
              bVar179 = bStack_b5;
              bVar180 = bStack_b4;
              bVar181 = bStack_b3;
              bVar182 = bStack_b2;
              bVar183 = bStack_b1;
              bVar184 = bStack_b0;
              bVar185 = bStack_af;
              bVar186 = bStack_ae;
              bVar187 = bStack_ad;
              bVar188 = bStack_ac;
              bVar189 = bStack_ab;
              bVar190 = bStack_aa;
              bVar191 = bStack_a9;
              do {
                uVar82 = ptr[uVar13][0];
                uVar65 = b_03[uVar13][0];
                uVar77 = b_04[uVar13][0];
                uVar29 = b_05[uVar13][0];
                auVar169._8_8_ = ptr[uVar13][1] << 8 | uVar82 >> 0x38;
                auVar79._0_8_ = uVar65 << 8;
                auVar79._8_8_ = b_03[uVar13][1] << 8 | uVar65 >> 0x38;
                auVar69._0_8_ = uVar77 << 8;
                auVar69._8_8_ = b_04[uVar13][1] << 8 | uVar77 >> 0x38;
                auVar30._0_8_ = uVar29 << 8;
                auVar30._8_8_ = b_05[uVar13][1] << 8 | uVar29 >> 0x38;
                auVar169._0_8_ = uVar82 << 8 | (ulong)(byte)ptr_06[uVar21];
                lVar23 = (long)ppVar4->mapper[(byte)s2[uVar21]] * uVar25 * 0x10;
                auVar73 = psubsb(auVar68,(undefined1  [16])*ptr_04);
                local_1d8 = ZEXT816(0);
                lVar14 = 0;
                local_228 = ZEXT816(0);
                local_1e8 = ZEXT816(0);
                auVar72 = auVar68;
                do {
                  auVar32 = *(undefined1 (*) [16])((long)*ptr + lVar14);
                  auVar74 = *(undefined1 (*) [16])((long)*b_03 + lVar14);
                  auVar172 = psubsb(auVar32,auVar66);
                  auVar136 = psubsb(*(undefined1 (*) [16])((long)*b + lVar14),auVar67);
                  cVar27 = auVar172[0];
                  cVar134 = auVar136[0];
                  auVar167[0] = -(cVar134 < cVar27);
                  cVar34 = auVar172[1];
                  cVar137 = auVar136[1];
                  auVar167[1] = -(cVar137 < cVar34);
                  cVar36 = auVar172[2];
                  cVar139 = auVar136[2];
                  auVar167[2] = -(cVar139 < cVar36);
                  cVar38 = auVar172[3];
                  cVar141 = auVar136[3];
                  auVar167[3] = -(cVar141 < cVar38);
                  cVar40 = auVar172[4];
                  cVar143 = auVar136[4];
                  auVar167[4] = -(cVar143 < cVar40);
                  cVar42 = auVar172[5];
                  cVar145 = auVar136[5];
                  auVar167[5] = -(cVar145 < cVar42);
                  cVar44 = auVar172[6];
                  cVar147 = auVar136[6];
                  auVar167[6] = -(cVar147 < cVar44);
                  cVar46 = auVar172[7];
                  cVar149 = auVar136[7];
                  auVar167[7] = -(cVar149 < cVar46);
                  cVar48 = auVar172[8];
                  cVar151 = auVar136[8];
                  auVar167[8] = -(cVar151 < cVar48);
                  cVar51 = auVar172[9];
                  cVar153 = auVar136[9];
                  auVar167[9] = -(cVar153 < cVar51);
                  cVar53 = auVar172[10];
                  cVar155 = auVar136[10];
                  auVar167[10] = -(cVar155 < cVar53);
                  cVar55 = auVar172[0xb];
                  cVar157 = auVar136[0xb];
                  auVar167[0xb] = -(cVar157 < cVar55);
                  cVar57 = auVar172[0xc];
                  cVar159 = auVar136[0xc];
                  auVar167[0xc] = -(cVar159 < cVar57);
                  cVar59 = auVar172[0xd];
                  cVar161 = auVar136[0xd];
                  auVar167[0xd] = -(cVar161 < cVar59);
                  cVar61 = auVar172[0xe];
                  cVar163 = auVar136[0xe];
                  cVar63 = auVar172[0xf];
                  auVar167[0xe] = -(cVar163 < cVar61);
                  cVar165 = auVar136[0xf];
                  auVar167[0xf] = -(cVar165 < cVar63);
                  auVar80 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar14),auVar74,auVar167);
                  auVar136 = *(undefined1 (*) [16])((long)*b_04 + lVar14);
                  auVar133 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar14),auVar136,auVar167
                                     );
                  auVar172 = *(undefined1 (*) [16])((long)*b_05 + lVar14);
                  auVar167 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar14),auVar172,auVar167
                                     );
                  auVar73 = paddsb(auVar73,*(undefined1 (*) [16])((long)*ptr_04 + lVar14));
                  cVar28 = auVar73[0];
                  cVar117 = auVar72[0];
                  auVar175[0] = -(cVar117 < cVar28);
                  cVar35 = auVar73[1];
                  cVar118 = auVar72[1];
                  auVar175[1] = -(cVar118 < cVar35);
                  cVar37 = auVar73[2];
                  cVar119 = auVar72[2];
                  auVar175[2] = -(cVar119 < cVar37);
                  cVar39 = auVar73[3];
                  cVar120 = auVar72[3];
                  auVar175[3] = -(cVar120 < cVar39);
                  cVar41 = auVar73[4];
                  cVar121 = auVar72[4];
                  auVar175[4] = -(cVar121 < cVar41);
                  cVar43 = auVar73[5];
                  cVar122 = auVar72[5];
                  auVar175[5] = -(cVar122 < cVar43);
                  cVar45 = auVar73[6];
                  cVar123 = auVar72[6];
                  auVar175[6] = -(cVar123 < cVar45);
                  cVar47 = auVar73[7];
                  cVar124 = auVar72[7];
                  auVar175[7] = -(cVar124 < cVar47);
                  cVar49 = auVar73[8];
                  cVar125 = auVar72[8];
                  auVar175[8] = -(cVar125 < cVar49);
                  cVar52 = auVar73[9];
                  cVar126 = auVar72[9];
                  auVar175[9] = -(cVar126 < cVar52);
                  cVar54 = auVar73[10];
                  cVar127 = auVar72[10];
                  auVar175[10] = -(cVar127 < cVar54);
                  cVar56 = auVar73[0xb];
                  cVar128 = auVar72[0xb];
                  auVar175[0xb] = -(cVar128 < cVar56);
                  cVar58 = auVar73[0xc];
                  cVar129 = auVar72[0xc];
                  auVar175[0xc] = -(cVar129 < cVar58);
                  cVar60 = auVar73[0xd];
                  cVar130 = auVar72[0xd];
                  auVar175[0xd] = -(cVar130 < cVar60);
                  cVar62 = auVar73[0xe];
                  cVar131 = auVar72[0xe];
                  cVar64 = auVar73[0xf];
                  auVar175[0xe] = -(cVar131 < cVar62);
                  cVar132 = auVar72[0xf];
                  auVar175[0xf] = -(cVar132 < cVar64);
                  local_1e8 = pblendvb(local_1e8,local_198,auVar175);
                  local_228 = pblendvb(local_228,local_1a8,auVar175);
                  bVar135 = (cVar134 < cVar27) * cVar27 | (cVar134 >= cVar27) * cVar134;
                  bVar138 = (cVar137 < cVar34) * cVar34 | (cVar137 >= cVar34) * cVar137;
                  bVar140 = (cVar139 < cVar36) * cVar36 | (cVar139 >= cVar36) * cVar139;
                  bVar142 = (cVar141 < cVar38) * cVar38 | (cVar141 >= cVar38) * cVar141;
                  bVar144 = (cVar143 < cVar40) * cVar40 | (cVar143 >= cVar40) * cVar143;
                  bVar146 = (cVar145 < cVar42) * cVar42 | (cVar145 >= cVar42) * cVar145;
                  bVar148 = (cVar147 < cVar44) * cVar44 | (cVar147 >= cVar44) * cVar147;
                  bVar150 = (cVar149 < cVar46) * cVar46 | (cVar149 >= cVar46) * cVar149;
                  bVar152 = (cVar151 < cVar48) * cVar48 | (cVar151 >= cVar48) * cVar151;
                  bVar154 = (cVar153 < cVar51) * cVar51 | (cVar153 >= cVar51) * cVar153;
                  bVar156 = (cVar155 < cVar53) * cVar53 | (cVar155 >= cVar53) * cVar155;
                  bVar158 = (cVar157 < cVar55) * cVar55 | (cVar157 >= cVar55) * cVar157;
                  bVar160 = (cVar159 < cVar57) * cVar57 | (cVar159 >= cVar57) * cVar159;
                  bVar162 = (cVar161 < cVar59) * cVar59 | (cVar161 >= cVar59) * cVar161;
                  bVar164 = (cVar163 < cVar61) * cVar61 | (cVar163 >= cVar61) * cVar163;
                  bVar166 = (cVar165 < cVar63) * cVar63 | (cVar165 >= cVar63) * cVar165;
                  auVar72[0] = (cVar28 < cVar117) * cVar117 | (cVar28 >= cVar117) * cVar28;
                  auVar72[1] = (cVar35 < cVar118) * cVar118 | (cVar35 >= cVar118) * cVar35;
                  auVar72[2] = (cVar37 < cVar119) * cVar119 | (cVar37 >= cVar119) * cVar37;
                  auVar72[3] = (cVar39 < cVar120) * cVar120 | (cVar39 >= cVar120) * cVar39;
                  auVar72[4] = (cVar41 < cVar121) * cVar121 | (cVar41 >= cVar121) * cVar41;
                  auVar72[5] = (cVar43 < cVar122) * cVar122 | (cVar43 >= cVar122) * cVar43;
                  auVar72[6] = (cVar45 < cVar123) * cVar123 | (cVar45 >= cVar123) * cVar45;
                  auVar72[7] = (cVar47 < cVar124) * cVar124 | (cVar47 >= cVar124) * cVar47;
                  auVar72[8] = (cVar49 < cVar125) * cVar125 | (cVar49 >= cVar125) * cVar49;
                  auVar72[9] = (cVar52 < cVar126) * cVar126 | (cVar52 >= cVar126) * cVar52;
                  auVar72[10] = (cVar54 < cVar127) * cVar127 | (cVar54 >= cVar127) * cVar54;
                  auVar72[0xb] = (cVar56 < cVar128) * cVar128 | (cVar56 >= cVar128) * cVar56;
                  auVar72[0xc] = (cVar58 < cVar129) * cVar129 | (cVar58 >= cVar129) * cVar58;
                  auVar72[0xd] = (cVar60 < cVar130) * cVar130 | (cVar60 >= cVar130) * cVar60;
                  auVar72[0xe] = (cVar62 < cVar131) * cVar131 | (cVar62 >= cVar131) * cVar62;
                  auVar72[0xf] = (cVar64 < cVar132) * cVar132 | (cVar64 >= cVar132) * cVar64;
                  auVar73 = paddsb(local_188,*(undefined1 (*) [16])((long)*ptr_05 + lVar14));
                  local_1d8 = pblendvb(local_1d8,auVar73,auVar175);
                  auVar175 = paddsb(auVar169,*(undefined1 (*) [16])((long)pvVar3 + lVar14 + lVar23))
                  ;
                  auVar169 = paddsb(auVar79,*(undefined1 (*) [16])((long)pvVar5 + lVar14 + lVar23));
                  auVar79 = paddsb(auVar69,*(undefined1 (*) [16])((long)pvVar6 + lVar14 + lVar23));
                  cVar27 = auVar175[0];
                  auVar31[0] = -(cVar27 < (char)bVar135);
                  cVar28 = auVar175[1];
                  auVar31[1] = -(cVar28 < (char)bVar138);
                  cVar34 = auVar175[2];
                  auVar31[2] = -(cVar34 < (char)bVar140);
                  cVar35 = auVar175[3];
                  auVar31[3] = -(cVar35 < (char)bVar142);
                  cVar36 = auVar175[4];
                  auVar31[4] = -(cVar36 < (char)bVar144);
                  cVar37 = auVar175[5];
                  auVar31[5] = -(cVar37 < (char)bVar146);
                  cVar38 = auVar175[6];
                  auVar31[6] = -(cVar38 < (char)bVar148);
                  cVar39 = auVar175[7];
                  auVar31[7] = -(cVar39 < (char)bVar150);
                  cVar40 = auVar175[8];
                  auVar31[8] = -(cVar40 < (char)bVar152);
                  cVar41 = auVar175[9];
                  auVar31[9] = -(cVar41 < (char)bVar154);
                  cVar42 = auVar175[10];
                  auVar31[10] = -(cVar42 < (char)bVar156);
                  cVar43 = auVar175[0xb];
                  auVar31[0xb] = -(cVar43 < (char)bVar158);
                  cVar44 = auVar175[0xc];
                  auVar31[0xc] = -(cVar44 < (char)bVar160);
                  cVar45 = auVar175[0xd];
                  auVar31[0xd] = -(cVar45 < (char)bVar162);
                  cVar46 = auVar175[0xe];
                  auVar31[0xe] = -(cVar46 < (char)bVar164);
                  cVar47 = auVar175[0xf];
                  auVar31[0xf] = -(cVar47 < (char)bVar166);
                  local_198 = pblendvb(auVar169,auVar80,auVar31);
                  local_1a8 = pblendvb(auVar79,auVar133,auVar31);
                  auVar69 = paddsb(auVar167,_DAT_008d0c20);
                  auVar30 = paddsb(auVar30,_DAT_008d0c20);
                  local_188 = pblendvb(auVar30,auVar69,auVar31);
                  pbVar1 = (byte *)((long)*b + lVar14);
                  *pbVar1 = bVar135;
                  pbVar1[1] = bVar138;
                  pbVar1[2] = bVar140;
                  pbVar1[3] = bVar142;
                  pbVar1[4] = bVar144;
                  pbVar1[5] = bVar146;
                  pbVar1[6] = bVar148;
                  pbVar1[7] = bVar150;
                  pbVar1[8] = bVar152;
                  pbVar1[9] = bVar154;
                  pbVar1[10] = bVar156;
                  pbVar1[0xb] = bVar158;
                  pbVar1[0xc] = bVar160;
                  pbVar1[0xd] = bVar162;
                  pbVar1[0xe] = bVar164;
                  pbVar1[0xf] = bVar166;
                  *(undefined1 (*) [16])((long)*b_00 + lVar14) = auVar80;
                  *(undefined1 (*) [16])((long)*b_01 + lVar14) = auVar133;
                  *(undefined1 (*) [16])((long)*b_02 + lVar14) = auVar69;
                  bVar135 = ((char)bVar135 < cVar27) * cVar27 | ((char)bVar135 >= cVar27) * bVar135;
                  bVar138 = ((char)bVar138 < cVar28) * cVar28 | ((char)bVar138 >= cVar28) * bVar138;
                  bVar140 = ((char)bVar140 < cVar34) * cVar34 | ((char)bVar140 >= cVar34) * bVar140;
                  bVar142 = ((char)bVar142 < cVar35) * cVar35 | ((char)bVar142 >= cVar35) * bVar142;
                  bVar144 = ((char)bVar144 < cVar36) * cVar36 | ((char)bVar144 >= cVar36) * bVar144;
                  bVar146 = ((char)bVar146 < cVar37) * cVar37 | ((char)bVar146 >= cVar37) * bVar146;
                  bVar148 = ((char)bVar148 < cVar38) * cVar38 | ((char)bVar148 >= cVar38) * bVar148;
                  bVar150 = ((char)bVar150 < cVar39) * cVar39 | ((char)bVar150 >= cVar39) * bVar150;
                  auVar73._0_8_ =
                       CONCAT17(bVar150,CONCAT16(bVar148,CONCAT15(bVar146,CONCAT14(bVar144,CONCAT13(
                                                  bVar142,CONCAT12(bVar140,CONCAT11(bVar138,bVar135)
                                                                  ))))));
                  auVar73[8] = ((char)bVar152 < cVar40) * cVar40 |
                               ((char)bVar152 >= cVar40) * bVar152;
                  auVar73[9] = ((char)bVar154 < cVar41) * cVar41 |
                               ((char)bVar154 >= cVar41) * bVar154;
                  auVar73[10] = ((char)bVar156 < cVar42) * cVar42 |
                                ((char)bVar156 >= cVar42) * bVar156;
                  auVar73[0xb] = ((char)bVar158 < cVar43) * cVar43 |
                                 ((char)bVar158 >= cVar43) * bVar158;
                  auVar73[0xc] = ((char)bVar160 < cVar44) * cVar44 |
                                 ((char)bVar160 >= cVar44) * bVar160;
                  auVar73[0xd] = ((char)bVar162 < cVar45) * cVar45 |
                                 ((char)bVar162 >= cVar45) * bVar162;
                  auVar73[0xe] = ((char)bVar164 < cVar46) * cVar46 |
                                 ((char)bVar164 >= cVar46) * bVar164;
                  auVar73[0xf] = ((char)bVar166 < cVar47) * cVar47 |
                                 ((char)bVar166 >= cVar47) * bVar166;
                  *(undefined1 (*) [16])((long)*ptr + lVar14) = auVar175;
                  *(undefined1 (*) [16])((long)*b_03 + lVar14) = auVar169;
                  *(undefined1 (*) [16])((long)*b_04 + lVar14) = auVar79;
                  *(undefined1 (*) [16])((long)*b_05 + lVar14) = auVar30;
                  auVar167 = _DAT_008d0c20;
                  lVar14 = lVar14 + 0x10;
                  auVar30 = auVar172;
                  auVar69 = auVar136;
                  auVar79 = auVar74;
                  auVar169 = auVar32;
                } while (lVar12 != lVar14);
                auVar74._8_8_ = auVar73._8_8_ << 8 | (ulong)bVar150;
                lVar14 = local_198._8_8_;
                uVar82 = local_198._0_8_;
                local_198._0_8_ = uVar82 << 8;
                local_198._8_8_ = lVar14 << 8 | uVar82 >> 0x38;
                lVar14 = local_1a8._8_8_;
                uVar82 = local_1a8._0_8_;
                local_1a8._0_8_ = uVar82 << 8;
                local_1a8._8_8_ = lVar14 << 8 | uVar82 >> 0x38;
                lVar14 = local_188._8_8_;
                uVar82 = local_188._0_8_;
                local_188._0_8_ = uVar82 << 8;
                local_188._8_8_ = lVar14 << 8 | uVar82 >> 0x38;
                bVar152 = ptr_06[uVar21 + 1];
                auVar74._0_8_ = auVar73._0_8_ << 8 | (ulong)bVar152;
                uVar21 = uVar21 + 1;
                auVar30 = paddsb((undefined1  [16])*ptr_04,auVar74);
                cVar27 = auVar30[0];
                auVar32[0] = -(cVar27 < (char)auVar72[0]);
                cVar28 = auVar30[1];
                auVar32[1] = -(cVar28 < (char)auVar72[1]);
                cVar34 = auVar30[2];
                auVar32[2] = -(cVar34 < (char)auVar72[2]);
                cVar35 = auVar30[3];
                auVar32[3] = -(cVar35 < (char)auVar72[3]);
                cVar36 = auVar30[4];
                auVar32[4] = -(cVar36 < (char)auVar72[4]);
                cVar37 = auVar30[5];
                auVar32[5] = -(cVar37 < (char)auVar72[5]);
                cVar38 = auVar30[6];
                auVar32[6] = -(cVar38 < (char)auVar72[6]);
                cVar39 = auVar30[7];
                auVar32[7] = -(cVar39 < (char)auVar72[7]);
                cVar40 = auVar30[8];
                auVar32[8] = -(cVar40 < (char)auVar72[8]);
                cVar41 = auVar30[9];
                auVar32[9] = -(cVar41 < (char)auVar72[9]);
                cVar42 = auVar30[10];
                auVar32[10] = -(cVar42 < (char)auVar72[10]);
                cVar43 = auVar30[0xb];
                auVar32[0xb] = -(cVar43 < (char)auVar72[0xb]);
                cVar44 = auVar30[0xc];
                auVar32[0xc] = -(cVar44 < (char)auVar72[0xc]);
                cVar45 = auVar30[0xd];
                auVar32[0xd] = -(cVar45 < (char)auVar72[0xd]);
                cVar46 = auVar30[0xe];
                auVar32[0xe] = -(cVar46 < (char)auVar72[0xe]);
                cVar47 = auVar30[0xf];
                auVar32[0xf] = -(cVar47 < (char)auVar72[0xf]);
                auVar136[0] = (cVar27 < (char)auVar72[0]) * auVar72[0] |
                              (cVar27 >= (char)auVar72[0]) * cVar27;
                auVar136[1] = (cVar28 < (char)auVar72[1]) * auVar72[1] |
                              (cVar28 >= (char)auVar72[1]) * cVar28;
                auVar136[2] = (cVar34 < (char)auVar72[2]) * auVar72[2] |
                              (cVar34 >= (char)auVar72[2]) * cVar34;
                auVar136[3] = (cVar35 < (char)auVar72[3]) * auVar72[3] |
                              (cVar35 >= (char)auVar72[3]) * cVar35;
                auVar136[4] = (cVar36 < (char)auVar72[4]) * auVar72[4] |
                              (cVar36 >= (char)auVar72[4]) * cVar36;
                auVar136[5] = (cVar37 < (char)auVar72[5]) * auVar72[5] |
                              (cVar37 >= (char)auVar72[5]) * cVar37;
                auVar136[6] = (cVar38 < (char)auVar72[6]) * auVar72[6] |
                              (cVar38 >= (char)auVar72[6]) * cVar38;
                auVar136[7] = (cVar39 < (char)auVar72[7]) * auVar72[7] |
                              (cVar39 >= (char)auVar72[7]) * cVar39;
                auVar136[8] = (cVar40 < (char)auVar72[8]) * auVar72[8] |
                              (cVar40 >= (char)auVar72[8]) * cVar40;
                auVar136[9] = (cVar41 < (char)auVar72[9]) * auVar72[9] |
                              (cVar41 >= (char)auVar72[9]) * cVar41;
                auVar136[10] = (cVar42 < (char)auVar72[10]) * auVar72[10] |
                               (cVar42 >= (char)auVar72[10]) * cVar42;
                auVar136[0xb] =
                     (cVar43 < (char)auVar72[0xb]) * auVar72[0xb] |
                     (cVar43 >= (char)auVar72[0xb]) * cVar43;
                auVar136[0xc] =
                     (cVar44 < (char)auVar72[0xc]) * auVar72[0xc] |
                     (cVar44 >= (char)auVar72[0xc]) * cVar44;
                auVar136[0xd] =
                     (cVar45 < (char)auVar72[0xd]) * auVar72[0xd] |
                     (cVar45 >= (char)auVar72[0xd]) * cVar45;
                auVar136[0xe] =
                     (cVar46 < (char)auVar72[0xe]) * auVar72[0xe] |
                     (cVar46 >= (char)auVar72[0xe]) * cVar46;
                auVar136[0xf] =
                     (cVar47 < (char)auVar72[0xf]) * auVar72[0xf] |
                     (cVar47 >= (char)auVar72[0xf]) * cVar47;
                auVar30 = pblendvb(local_198,local_1e8,auVar32);
                auVar72 = pblendvb(local_1a8,local_228,auVar32);
                auVar69 = paddsb((undefined1  [16])*ptr_05,local_188);
                auVar69 = pblendvb(auVar69,local_1d8,auVar32);
                iVar20 = 0xe;
                do {
                  auVar80._0_8_ = auVar136._0_8_ << 8;
                  auVar80._8_8_ = auVar136._8_8_ << 8 | auVar136._0_8_ >> 0x38;
                  auVar79 = paddsb(auVar80,auVar71);
                  auVar133._0_8_ = auVar30._0_8_ << 8;
                  auVar133._8_8_ = auVar30._8_8_ << 8 | auVar30._0_8_ >> 0x38;
                  cVar27 = auVar136[0];
                  cVar48 = auVar79[0];
                  auVar172[0] = -(cVar48 < cVar27);
                  cVar28 = auVar136[1];
                  cVar49 = auVar79[1];
                  auVar172[1] = -(cVar49 < cVar28);
                  cVar34 = auVar136[2];
                  cVar51 = auVar79[2];
                  auVar172[2] = -(cVar51 < cVar34);
                  cVar35 = auVar136[3];
                  cVar52 = auVar79[3];
                  auVar172[3] = -(cVar52 < cVar35);
                  cVar36 = auVar136[4];
                  cVar53 = auVar79[4];
                  auVar172[4] = -(cVar53 < cVar36);
                  cVar37 = auVar136[5];
                  cVar54 = auVar79[5];
                  auVar172[5] = -(cVar54 < cVar37);
                  cVar38 = auVar136[6];
                  cVar55 = auVar79[6];
                  auVar172[6] = -(cVar55 < cVar38);
                  cVar39 = auVar136[7];
                  cVar56 = auVar79[7];
                  auVar172[7] = -(cVar56 < cVar39);
                  cVar40 = auVar136[8];
                  cVar57 = auVar79[8];
                  auVar172[8] = -(cVar57 < cVar40);
                  cVar41 = auVar136[9];
                  cVar58 = auVar79[9];
                  auVar172[9] = -(cVar58 < cVar41);
                  cVar42 = auVar136[10];
                  cVar59 = auVar79[10];
                  auVar172[10] = -(cVar59 < cVar42);
                  cVar43 = auVar136[0xb];
                  cVar60 = auVar79[0xb];
                  auVar172[0xb] = -(cVar60 < cVar43);
                  cVar44 = auVar136[0xc];
                  cVar61 = auVar79[0xc];
                  auVar172[0xc] = -(cVar61 < cVar44);
                  cVar45 = auVar136[0xd];
                  cVar62 = auVar79[0xd];
                  auVar172[0xd] = -(cVar62 < cVar45);
                  cVar46 = auVar136[0xe];
                  cVar63 = auVar79[0xe];
                  cVar47 = auVar136[0xf];
                  auVar172[0xe] = -(cVar63 < cVar46);
                  cVar64 = auVar79[0xf];
                  auVar172[0xf] = -(cVar64 < cVar47);
                  auVar30 = pblendvb(auVar133,auVar30,auVar172);
                  auVar170._0_8_ = auVar72._0_8_ << 8;
                  auVar170._8_8_ = auVar72._8_8_ << 8 | auVar72._0_8_ >> 0x38;
                  auVar173._0_8_ = auVar69._0_8_ << 8;
                  auVar173._8_8_ = auVar69._8_8_ << 8 | auVar69._0_8_ >> 0x38;
                  auVar79 = paddsb(auVar173,auVar70);
                  bVar154 = (cVar56 < cVar39) * cVar39 | (cVar56 >= cVar39) * cVar56;
                  auVar136._0_8_ =
                       CONCAT17(bVar154,CONCAT16((cVar55 < cVar38) * cVar38 |
                                                 (cVar55 >= cVar38) * cVar55,
                                                 CONCAT15((cVar54 < cVar37) * cVar37 |
                                                          (cVar54 >= cVar37) * cVar54,
                                                          CONCAT14((cVar53 < cVar36) * cVar36 |
                                                                   (cVar53 >= cVar36) * cVar53,
                                                                   CONCAT13((cVar52 < cVar35) *
                                                                            cVar35 | (cVar52 >=
                                                                                     cVar35) * 
                                                  cVar52,CONCAT12((cVar51 < cVar34) * cVar34 |
                                                                  (cVar51 >= cVar34) * cVar51,
                                                                  CONCAT11((cVar49 < cVar28) *
                                                                           cVar28 | (cVar49 >=
                                                                                    cVar28) * cVar49
                                                                           ,(cVar48 < cVar27) *
                                                                            cVar27 | (cVar48 >=
                                                                                     cVar27) * 
                                                  cVar48)))))));
                  auVar136[8] = (cVar57 < cVar40) * cVar40 | (cVar57 >= cVar40) * cVar57;
                  auVar136[9] = (cVar58 < cVar41) * cVar41 | (cVar58 >= cVar41) * cVar58;
                  auVar136[10] = (cVar59 < cVar42) * cVar42 | (cVar59 >= cVar42) * cVar59;
                  auVar136[0xb] = (cVar60 < cVar43) * cVar43 | (cVar60 >= cVar43) * cVar60;
                  auVar136[0xc] = (cVar61 < cVar44) * cVar44 | (cVar61 >= cVar44) * cVar61;
                  auVar136[0xd] = (cVar62 < cVar45) * cVar45 | (cVar62 >= cVar45) * cVar62;
                  auVar136[0xe] = (cVar63 < cVar46) * cVar46 | (cVar63 >= cVar46) * cVar63;
                  auVar136[0xf] = (cVar64 < cVar47) * cVar47 | (cVar64 >= cVar47) * cVar64;
                  auVar72 = pblendvb(auVar170,auVar72,auVar172);
                  auVar69 = pblendvb(auVar79,auVar69,auVar172);
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
                auVar84._0_8_ = auVar136._0_8_ << 8;
                auVar84._8_8_ = auVar136._8_8_ << 8 | (ulong)bVar154;
                auVar168._0_8_ = auVar30._0_8_ << 8;
                auVar168._8_8_ = auVar30._8_8_ << 8 | auVar30._0_8_ >> 0x38;
                auVar171._0_8_ = auVar72._0_8_ << 8;
                auVar171._8_8_ = auVar72._8_8_ << 8 | auVar72._0_8_ >> 0x38;
                auVar174._0_8_ = auVar69._0_8_ << 8;
                auVar174._8_8_ = auVar69._8_8_ << 8 | auVar69._0_8_ >> 0x38;
                auVar85 = paddsb(auVar84,auVar78);
                cVar27 = auVar85[0];
                auVar33[0] = -((char)bVar152 < cVar27);
                cVar28 = auVar85[1];
                auVar33[1] = -((char)bVar135 < cVar28);
                cVar34 = auVar85[2];
                auVar33[2] = -((char)bVar138 < cVar34);
                cVar35 = auVar85[3];
                auVar33[3] = -((char)bVar140 < cVar35);
                cVar36 = auVar85[4];
                auVar33[4] = -((char)bVar142 < cVar36);
                cVar37 = auVar85[5];
                auVar33[5] = -((char)bVar144 < cVar37);
                cVar38 = auVar85[6];
                auVar33[6] = -((char)bVar146 < cVar38);
                cVar39 = auVar85[7];
                auVar33[7] = -((char)bVar148 < cVar39);
                cVar40 = auVar85[8];
                auVar33[8] = -((char)bVar150 < cVar40);
                cVar41 = auVar85[9];
                auVar33[9] = -((char)auVar73[8] < cVar41);
                cVar42 = auVar85[10];
                auVar33[10] = -((char)auVar73[9] < cVar42);
                cVar43 = auVar85[0xb];
                auVar33[0xb] = -((char)auVar73[10] < cVar43);
                cVar44 = auVar85[0xc];
                auVar33[0xc] = -((char)auVar73[0xb] < cVar44);
                cVar45 = auVar85[0xd];
                auVar33[0xd] = -((char)auVar73[0xc] < cVar45);
                cVar46 = auVar85[0xe];
                cVar47 = auVar85[0xf];
                auVar33[0xe] = -((char)auVar73[0xd] < cVar46);
                auVar33[0xf] = -((char)auVar73[0xe] < cVar47);
                auVar75[0] = ((char)bVar152 < cVar27) * cVar27 | ((char)bVar152 >= cVar27) * bVar152
                ;
                auVar75[1] = ((char)bVar135 < cVar28) * cVar28 | ((char)bVar135 >= cVar28) * bVar135
                ;
                auVar75[2] = ((char)bVar138 < cVar34) * cVar34 | ((char)bVar138 >= cVar34) * bVar138
                ;
                auVar75[3] = ((char)bVar140 < cVar35) * cVar35 | ((char)bVar140 >= cVar35) * bVar140
                ;
                auVar75[4] = ((char)bVar142 < cVar36) * cVar36 | ((char)bVar142 >= cVar36) * bVar142
                ;
                auVar75[5] = ((char)bVar144 < cVar37) * cVar37 | ((char)bVar144 >= cVar37) * bVar144
                ;
                auVar75[6] = ((char)bVar146 < cVar38) * cVar38 | ((char)bVar146 >= cVar38) * bVar146
                ;
                auVar75[7] = ((char)bVar148 < cVar39) * cVar39 | ((char)bVar148 >= cVar39) * bVar148
                ;
                auVar75[8] = ((char)bVar150 < cVar40) * cVar40 | ((char)bVar150 >= cVar40) * bVar150
                ;
                auVar75[9] = ((char)auVar73[8] < cVar41) * cVar41 |
                             ((char)auVar73[8] >= cVar41) * auVar73[8];
                auVar75[10] = ((char)auVar73[9] < cVar42) * cVar42 |
                              ((char)auVar73[9] >= cVar42) * auVar73[9];
                auVar75[0xb] = ((char)auVar73[10] < cVar43) * cVar43 |
                               ((char)auVar73[10] >= cVar43) * auVar73[10];
                auVar75[0xc] = ((char)auVar73[0xb] < cVar44) * cVar44 |
                               ((char)auVar73[0xb] >= cVar44) * auVar73[0xb];
                auVar75[0xd] = ((char)auVar73[0xc] < cVar45) * cVar45 |
                               ((char)auVar73[0xc] >= cVar45) * auVar73[0xc];
                auVar75[0xe] = ((char)auVar73[0xd] < cVar46) * cVar46 |
                               ((char)auVar73[0xd] >= cVar46) * auVar73[0xd];
                auVar75[0xf] = ((char)auVar73[0xe] < cVar47) * cVar47 |
                               ((char)auVar73[0xe] >= cVar47) * auVar73[0xe];
                auVar69 = pblendvb(local_198,auVar168,auVar33);
                auVar30 = pblendvb(local_1a8,auVar171,auVar33);
                auVar72 = pblendvb(local_188,auVar174,auVar33);
                lVar14 = 0;
                do {
                  auVar79 = psubsb(auVar75,auVar66);
                  auVar169 = psubsb(auVar85,auVar67);
                  cVar27 = auVar79[0];
                  cVar48 = auVar169[0];
                  auVar76[0] = -(cVar48 < cVar27);
                  cVar28 = auVar79[1];
                  cVar49 = auVar169[1];
                  auVar76[1] = -(cVar49 < cVar28);
                  cVar34 = auVar79[2];
                  cVar51 = auVar169[2];
                  auVar76[2] = -(cVar51 < cVar34);
                  cVar35 = auVar79[3];
                  cVar52 = auVar169[3];
                  auVar76[3] = -(cVar52 < cVar35);
                  cVar36 = auVar79[4];
                  cVar53 = auVar169[4];
                  auVar76[4] = -(cVar53 < cVar36);
                  cVar37 = auVar79[5];
                  cVar54 = auVar169[5];
                  auVar76[5] = -(cVar54 < cVar37);
                  cVar38 = auVar79[6];
                  cVar55 = auVar169[6];
                  auVar76[6] = -(cVar55 < cVar38);
                  cVar39 = auVar79[7];
                  cVar56 = auVar169[7];
                  auVar76[7] = -(cVar56 < cVar39);
                  cVar40 = auVar79[8];
                  cVar57 = auVar169[8];
                  auVar76[8] = -(cVar57 < cVar40);
                  cVar41 = auVar79[9];
                  cVar58 = auVar169[9];
                  auVar76[9] = -(cVar58 < cVar41);
                  cVar42 = auVar79[10];
                  cVar59 = auVar169[10];
                  auVar76[10] = -(cVar59 < cVar42);
                  cVar43 = auVar79[0xb];
                  cVar60 = auVar169[0xb];
                  auVar76[0xb] = -(cVar60 < cVar43);
                  cVar44 = auVar79[0xc];
                  cVar61 = auVar169[0xc];
                  auVar76[0xc] = -(cVar61 < cVar44);
                  cVar45 = auVar79[0xd];
                  cVar62 = auVar169[0xd];
                  auVar76[0xd] = -(cVar62 < cVar45);
                  cVar46 = auVar79[0xe];
                  cVar63 = auVar169[0xe];
                  cVar47 = auVar79[0xf];
                  auVar76[0xe] = -(cVar63 < cVar46);
                  cVar64 = auVar169[0xf];
                  auVar76[0xf] = -(cVar64 < cVar47);
                  auVar168 = pblendvb(auVar168,auVar69,auVar76);
                  auVar171 = pblendvb(auVar171,auVar30,auVar76);
                  pbVar1 = (byte *)((long)*ptr + lVar14);
                  bVar135 = *pbVar1;
                  bVar138 = pbVar1[1];
                  bVar140 = pbVar1[2];
                  bVar142 = pbVar1[3];
                  bVar144 = pbVar1[4];
                  bVar146 = pbVar1[5];
                  bVar148 = pbVar1[6];
                  bVar150 = pbVar1[7];
                  bVar152 = pbVar1[8];
                  bVar154 = pbVar1[9];
                  bVar156 = pbVar1[10];
                  bVar158 = pbVar1[0xb];
                  bVar160 = pbVar1[0xc];
                  bVar162 = pbVar1[0xd];
                  bVar164 = pbVar1[0xe];
                  bVar166 = pbVar1[0xf];
                  auVar30 = pblendvb(auVar174,auVar72,auVar76);
                  auVar85[0] = (cVar27 < cVar48) * cVar48 | (cVar27 >= cVar48) * cVar27;
                  auVar85[1] = (cVar28 < cVar49) * cVar49 | (cVar28 >= cVar49) * cVar28;
                  auVar85[2] = (cVar34 < cVar51) * cVar51 | (cVar34 >= cVar51) * cVar34;
                  auVar85[3] = (cVar35 < cVar52) * cVar52 | (cVar35 >= cVar52) * cVar35;
                  auVar85[4] = (cVar36 < cVar53) * cVar53 | (cVar36 >= cVar53) * cVar36;
                  auVar85[5] = (cVar37 < cVar54) * cVar54 | (cVar37 >= cVar54) * cVar37;
                  auVar85[6] = (cVar38 < cVar55) * cVar55 | (cVar38 >= cVar55) * cVar38;
                  auVar85[7] = (cVar39 < cVar56) * cVar56 | (cVar39 >= cVar56) * cVar39;
                  auVar85[8] = (cVar40 < cVar57) * cVar57 | (cVar40 >= cVar57) * cVar40;
                  auVar85[9] = (cVar41 < cVar58) * cVar58 | (cVar41 >= cVar58) * cVar41;
                  auVar85[10] = (cVar42 < cVar59) * cVar59 | (cVar42 >= cVar59) * cVar42;
                  auVar85[0xb] = (cVar43 < cVar60) * cVar60 | (cVar43 >= cVar60) * cVar43;
                  auVar85[0xc] = (cVar44 < cVar61) * cVar61 | (cVar44 >= cVar61) * cVar44;
                  auVar85[0xd] = (cVar45 < cVar62) * cVar62 | (cVar45 >= cVar62) * cVar45;
                  auVar85[0xe] = (cVar46 < cVar63) * cVar63 | (cVar46 >= cVar63) * cVar46;
                  auVar85[0xf] = (cVar47 < cVar64) * cVar64 | (cVar47 >= cVar64) * cVar47;
                  pcVar2 = (char *)((long)*b + lVar14);
                  cVar27 = *pcVar2;
                  cVar28 = pcVar2[1];
                  cVar34 = pcVar2[2];
                  cVar35 = pcVar2[3];
                  cVar36 = pcVar2[4];
                  cVar37 = pcVar2[5];
                  cVar38 = pcVar2[6];
                  cVar39 = pcVar2[7];
                  cVar40 = pcVar2[8];
                  cVar41 = pcVar2[9];
                  cVar42 = pcVar2[10];
                  cVar43 = pcVar2[0xb];
                  cVar44 = pcVar2[0xc];
                  cVar45 = pcVar2[0xd];
                  cVar46 = pcVar2[0xe];
                  cVar47 = pcVar2[0xf];
                  bVar83 = (cVar27 < (char)bVar135) * bVar135 | (cVar27 >= (char)bVar135) * cVar27;
                  bVar87 = (cVar28 < (char)bVar138) * bVar138 | (cVar28 >= (char)bVar138) * cVar28;
                  bVar88 = (cVar34 < (char)bVar140) * bVar140 | (cVar34 >= (char)bVar140) * cVar34;
                  bVar89 = (cVar35 < (char)bVar142) * bVar142 | (cVar35 >= (char)bVar142) * cVar35;
                  bVar90 = (cVar36 < (char)bVar144) * bVar144 | (cVar36 >= (char)bVar144) * cVar36;
                  bVar91 = (cVar37 < (char)bVar146) * bVar146 | (cVar37 >= (char)bVar146) * cVar37;
                  bVar92 = (cVar38 < (char)bVar148) * bVar148 | (cVar38 >= (char)bVar148) * cVar38;
                  bVar93 = (cVar39 < (char)bVar150) * bVar150 | (cVar39 >= (char)bVar150) * cVar39;
                  bVar94 = (cVar40 < (char)bVar152) * bVar152 | (cVar40 >= (char)bVar152) * cVar40;
                  bVar95 = (cVar41 < (char)bVar154) * bVar154 | (cVar41 >= (char)bVar154) * cVar41;
                  bVar96 = (cVar42 < (char)bVar156) * bVar156 | (cVar42 >= (char)bVar156) * cVar42;
                  bVar97 = (cVar43 < (char)bVar158) * bVar158 | (cVar43 >= (char)bVar158) * cVar43;
                  bVar98 = (cVar44 < (char)bVar160) * bVar160 | (cVar44 >= (char)bVar160) * cVar44;
                  bVar99 = (cVar45 < (char)bVar162) * bVar162 | (cVar45 >= (char)bVar162) * cVar45;
                  bVar100 = (cVar46 < (char)bVar164) * bVar164 | (cVar46 >= (char)bVar164) * cVar46;
                  bVar101 = (cVar47 < (char)bVar166) * bVar166 | (cVar47 >= (char)bVar166) * cVar47;
                  auVar75[0] = ((char)bVar83 < (char)auVar85[0]) * auVar85[0] |
                               ((char)bVar83 >= (char)auVar85[0]) * bVar83;
                  auVar75[1] = ((char)bVar87 < (char)auVar85[1]) * auVar85[1] |
                               ((char)bVar87 >= (char)auVar85[1]) * bVar87;
                  auVar75[2] = ((char)bVar88 < (char)auVar85[2]) * auVar85[2] |
                               ((char)bVar88 >= (char)auVar85[2]) * bVar88;
                  auVar75[3] = ((char)bVar89 < (char)auVar85[3]) * auVar85[3] |
                               ((char)bVar89 >= (char)auVar85[3]) * bVar89;
                  auVar75[4] = ((char)bVar90 < (char)auVar85[4]) * auVar85[4] |
                               ((char)bVar90 >= (char)auVar85[4]) * bVar90;
                  auVar75[5] = ((char)bVar91 < (char)auVar85[5]) * auVar85[5] |
                               ((char)bVar91 >= (char)auVar85[5]) * bVar91;
                  auVar75[6] = ((char)bVar92 < (char)auVar85[6]) * auVar85[6] |
                               ((char)bVar92 >= (char)auVar85[6]) * bVar92;
                  auVar75[7] = ((char)bVar93 < (char)auVar85[7]) * auVar85[7] |
                               ((char)bVar93 >= (char)auVar85[7]) * bVar93;
                  auVar75[8] = ((char)bVar94 < (char)auVar85[8]) * auVar85[8] |
                               ((char)bVar94 >= (char)auVar85[8]) * bVar94;
                  auVar75[9] = ((char)bVar95 < (char)auVar85[9]) * auVar85[9] |
                               ((char)bVar95 >= (char)auVar85[9]) * bVar95;
                  auVar75[10] = ((char)bVar96 < (char)auVar85[10]) * auVar85[10] |
                                ((char)bVar96 >= (char)auVar85[10]) * bVar96;
                  auVar75[0xb] = ((char)bVar97 < (char)auVar85[0xb]) * auVar85[0xb] |
                                 ((char)bVar97 >= (char)auVar85[0xb]) * bVar97;
                  auVar75[0xc] = ((char)bVar98 < (char)auVar85[0xc]) * auVar85[0xc] |
                                 ((char)bVar98 >= (char)auVar85[0xc]) * bVar98;
                  auVar75[0xd] = ((char)bVar99 < (char)auVar85[0xd]) * auVar85[0xd] |
                                 ((char)bVar99 >= (char)auVar85[0xd]) * bVar99;
                  auVar75[0xe] = ((char)bVar100 < (char)auVar85[0xe]) * auVar85[0xe] |
                                 ((char)bVar100 >= (char)auVar85[0xe]) * bVar100;
                  auVar75[0xf] = ((char)bVar101 < (char)auVar85[0xf]) * auVar85[0xf] |
                                 ((char)bVar101 >= (char)auVar85[0xf]) * bVar101;
                  auVar81[0] = -(bVar135 == auVar75[0]);
                  auVar81[1] = -(bVar138 == auVar75[1]);
                  auVar81[2] = -(bVar140 == auVar75[2]);
                  auVar81[3] = -(bVar142 == auVar75[3]);
                  auVar81[4] = -(bVar144 == auVar75[4]);
                  auVar81[5] = -(bVar146 == auVar75[5]);
                  auVar81[6] = -(bVar148 == auVar75[6]);
                  auVar81[7] = -(bVar150 == auVar75[7]);
                  auVar81[8] = -(bVar152 == auVar75[8]);
                  auVar81[9] = -(bVar154 == auVar75[9]);
                  auVar81[10] = -(bVar156 == auVar75[10]);
                  auVar81[0xb] = -(bVar158 == auVar75[0xb]);
                  auVar81[0xc] = -(bVar160 == auVar75[0xc]);
                  auVar81[0xd] = -(bVar162 == auVar75[0xd]);
                  auVar81[0xe] = -(bVar164 == auVar75[0xe]);
                  auVar81[0xf] = -(bVar166 == auVar75[0xf]);
                  auVar86[0] = -((char)auVar85[0] < (char)bVar83);
                  auVar86[1] = -((char)auVar85[1] < (char)bVar87);
                  auVar86[2] = -((char)auVar85[2] < (char)bVar88);
                  auVar86[3] = -((char)auVar85[3] < (char)bVar89);
                  auVar86[4] = -((char)auVar85[4] < (char)bVar90);
                  auVar86[5] = -((char)auVar85[5] < (char)bVar91);
                  auVar86[6] = -((char)auVar85[6] < (char)bVar92);
                  auVar86[7] = -((char)auVar85[7] < (char)bVar93);
                  auVar86[8] = -((char)auVar85[8] < (char)bVar94);
                  auVar86[9] = -((char)auVar85[9] < (char)bVar95);
                  auVar86[10] = -((char)auVar85[10] < (char)bVar96);
                  auVar86[0xb] = -((char)auVar85[0xb] < (char)bVar97);
                  auVar86[0xc] = -((char)auVar85[0xc] < (char)bVar98);
                  auVar86[0xd] = -((char)auVar85[0xd] < (char)bVar99);
                  auVar86[0xe] = -((char)auVar85[0xe] < (char)bVar100);
                  auVar86[0xf] = -((char)auVar85[0xf] < (char)bVar101);
                  auVar72 = pblendvb(auVar168,*(undefined1 (*) [16])((long)*b_00 + lVar14),auVar86);
                  auVar69 = pblendvb(auVar72,*(undefined1 (*) [16])((long)*b_03 + lVar14),auVar81);
                  auVar174 = paddsb(auVar30,auVar167);
                  auVar30 = pblendvb(auVar171,*(undefined1 (*) [16])((long)*b_01 + lVar14),auVar86);
                  auVar30 = pblendvb(auVar30,*(undefined1 (*) [16])((long)*b_04 + lVar14),auVar81);
                  auVar72 = pblendvb(auVar174,*(undefined1 (*) [16])((long)*b_02 + lVar14),auVar86);
                  auVar72 = pblendvb(auVar72,*(undefined1 (*) [16])((long)*b_05 + lVar14),auVar81);
                  *(undefined1 (*) [16])((long)*ptr + lVar14) = auVar75;
                  *(undefined1 (*) [16])((long)*b_03 + lVar14) = auVar69;
                  *(undefined1 (*) [16])((long)*b_04 + lVar14) = auVar30;
                  *(undefined1 (*) [16])((long)*b_05 + lVar14) = auVar72;
                  bVar176 = ((char)auVar75[0] < (char)bVar176) * auVar75[0] |
                            ((char)auVar75[0] >= (char)bVar176) * bVar176;
                  bVar177 = ((char)auVar75[1] < (char)bVar177) * auVar75[1] |
                            ((char)auVar75[1] >= (char)bVar177) * bVar177;
                  bVar178 = ((char)auVar75[2] < (char)bVar178) * auVar75[2] |
                            ((char)auVar75[2] >= (char)bVar178) * bVar178;
                  bVar179 = ((char)auVar75[3] < (char)bVar179) * auVar75[3] |
                            ((char)auVar75[3] >= (char)bVar179) * bVar179;
                  bVar180 = ((char)auVar75[4] < (char)bVar180) * auVar75[4] |
                            ((char)auVar75[4] >= (char)bVar180) * bVar180;
                  bVar181 = ((char)auVar75[5] < (char)bVar181) * auVar75[5] |
                            ((char)auVar75[5] >= (char)bVar181) * bVar181;
                  bVar182 = ((char)auVar75[6] < (char)bVar182) * auVar75[6] |
                            ((char)auVar75[6] >= (char)bVar182) * bVar182;
                  bVar183 = ((char)auVar75[7] < (char)bVar183) * auVar75[7] |
                            ((char)auVar75[7] >= (char)bVar183) * bVar183;
                  bVar184 = ((char)auVar75[8] < (char)bVar184) * auVar75[8] |
                            ((char)auVar75[8] >= (char)bVar184) * bVar184;
                  bVar185 = ((char)auVar75[9] < (char)bVar185) * auVar75[9] |
                            ((char)auVar75[9] >= (char)bVar185) * bVar185;
                  bVar186 = ((char)auVar75[10] < (char)bVar186) * auVar75[10] |
                            ((char)auVar75[10] >= (char)bVar186) * bVar186;
                  bVar187 = ((char)auVar75[0xb] < (char)bVar187) * auVar75[0xb] |
                            ((char)auVar75[0xb] >= (char)bVar187) * bVar187;
                  bVar188 = ((char)auVar75[0xc] < (char)bVar188) * auVar75[0xc] |
                            ((char)auVar75[0xc] >= (char)bVar188) * bVar188;
                  bVar189 = ((char)auVar75[0xd] < (char)bVar189) * auVar75[0xd] |
                            ((char)auVar75[0xd] >= (char)bVar189) * bVar189;
                  bVar190 = ((char)auVar75[0xe] < (char)bVar190) * auVar75[0xe] |
                            ((char)auVar75[0xe] >= (char)bVar190) * bVar190;
                  bVar191 = ((char)auVar75[0xf] < (char)bVar191) * auVar75[0xf] |
                            ((char)auVar75[0xf] >= (char)bVar191) * bVar191;
                  bVar7 = ((char)bVar7 < (char)auVar75[0]) * auVar75[0] |
                          ((char)bVar7 >= (char)auVar75[0]) * bVar7;
                  bVar102 = ((char)bVar102 < (char)auVar75[1]) * auVar75[1] |
                            ((char)bVar102 >= (char)auVar75[1]) * bVar102;
                  bVar103 = ((char)bVar103 < (char)auVar75[2]) * auVar75[2] |
                            ((char)bVar103 >= (char)auVar75[2]) * bVar103;
                  bVar104 = ((char)bVar104 < (char)auVar75[3]) * auVar75[3] |
                            ((char)bVar104 >= (char)auVar75[3]) * bVar104;
                  bVar105 = ((char)bVar105 < (char)auVar75[4]) * auVar75[4] |
                            ((char)bVar105 >= (char)auVar75[4]) * bVar105;
                  bVar106 = ((char)bVar106 < (char)auVar75[5]) * auVar75[5] |
                            ((char)bVar106 >= (char)auVar75[5]) * bVar106;
                  bVar107 = ((char)bVar107 < (char)auVar75[6]) * auVar75[6] |
                            ((char)bVar107 >= (char)auVar75[6]) * bVar107;
                  bVar108 = ((char)bVar108 < (char)auVar75[7]) * auVar75[7] |
                            ((char)bVar108 >= (char)auVar75[7]) * bVar108;
                  bVar109 = ((char)bVar109 < (char)auVar75[8]) * auVar75[8] |
                            ((char)bVar109 >= (char)auVar75[8]) * bVar109;
                  bVar110 = ((char)bVar110 < (char)auVar75[9]) * auVar75[9] |
                            ((char)bVar110 >= (char)auVar75[9]) * bVar110;
                  bVar111 = ((char)bVar111 < (char)auVar75[10]) * auVar75[10] |
                            ((char)bVar111 >= (char)auVar75[10]) * bVar111;
                  bVar112 = ((char)bVar112 < (char)auVar75[0xb]) * auVar75[0xb] |
                            ((char)bVar112 >= (char)auVar75[0xb]) * bVar112;
                  bVar113 = ((char)bVar113 < (char)auVar75[0xc]) * auVar75[0xc] |
                            ((char)bVar113 >= (char)auVar75[0xc]) * bVar113;
                  bVar114 = ((char)bVar114 < (char)auVar75[0xd]) * auVar75[0xd] |
                            ((char)bVar114 >= (char)auVar75[0xd]) * bVar114;
                  bVar115 = ((char)bVar115 < (char)auVar75[0xe]) * auVar75[0xe] |
                            ((char)bVar115 >= (char)auVar75[0xe]) * bVar115;
                  bVar116 = ((char)bVar116 < (char)auVar75[0xf]) * auVar75[0xf] |
                            ((char)bVar116 >= (char)auVar75[0xf]) * bVar116;
                  cVar27 = auVar69[0];
                  bVar7 = ((char)bVar7 < cVar27) * cVar27 | ((char)bVar7 >= cVar27) * bVar7;
                  cVar27 = auVar69[1];
                  bVar102 = ((char)bVar102 < cVar27) * cVar27 | ((char)bVar102 >= cVar27) * bVar102;
                  cVar27 = auVar69[2];
                  bVar103 = ((char)bVar103 < cVar27) * cVar27 | ((char)bVar103 >= cVar27) * bVar103;
                  cVar27 = auVar69[3];
                  bVar104 = ((char)bVar104 < cVar27) * cVar27 | ((char)bVar104 >= cVar27) * bVar104;
                  cVar27 = auVar69[4];
                  bVar105 = ((char)bVar105 < cVar27) * cVar27 | ((char)bVar105 >= cVar27) * bVar105;
                  cVar27 = auVar69[5];
                  bVar106 = ((char)bVar106 < cVar27) * cVar27 | ((char)bVar106 >= cVar27) * bVar106;
                  cVar27 = auVar69[6];
                  bVar107 = ((char)bVar107 < cVar27) * cVar27 | ((char)bVar107 >= cVar27) * bVar107;
                  cVar27 = auVar69[7];
                  bVar108 = ((char)bVar108 < cVar27) * cVar27 | ((char)bVar108 >= cVar27) * bVar108;
                  cVar27 = auVar69[8];
                  bVar109 = ((char)bVar109 < cVar27) * cVar27 | ((char)bVar109 >= cVar27) * bVar109;
                  cVar27 = auVar69[9];
                  bVar110 = ((char)bVar110 < cVar27) * cVar27 | ((char)bVar110 >= cVar27) * bVar110;
                  cVar27 = auVar69[10];
                  bVar111 = ((char)bVar111 < cVar27) * cVar27 | ((char)bVar111 >= cVar27) * bVar111;
                  cVar27 = auVar69[0xb];
                  bVar112 = ((char)bVar112 < cVar27) * cVar27 | ((char)bVar112 >= cVar27) * bVar112;
                  cVar27 = auVar69[0xc];
                  bVar113 = ((char)bVar113 < cVar27) * cVar27 | ((char)bVar113 >= cVar27) * bVar113;
                  cVar27 = auVar69[0xd];
                  bVar114 = ((char)bVar114 < cVar27) * cVar27 | ((char)bVar114 >= cVar27) * bVar114;
                  cVar27 = auVar69[0xe];
                  bVar115 = ((char)bVar115 < cVar27) * cVar27 | ((char)bVar115 >= cVar27) * bVar115;
                  cVar27 = auVar69[0xf];
                  bVar116 = ((char)bVar116 < cVar27) * cVar27 | ((char)bVar116 >= cVar27) * bVar116;
                  cVar27 = auVar72[0];
                  cVar28 = auVar30[0];
                  bVar135 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[1];
                  cVar28 = auVar30[1];
                  bVar138 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[2];
                  cVar28 = auVar30[2];
                  bVar140 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[3];
                  cVar28 = auVar30[3];
                  bVar142 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[4];
                  cVar28 = auVar30[4];
                  bVar144 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[5];
                  cVar28 = auVar30[5];
                  bVar146 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[6];
                  cVar28 = auVar30[6];
                  bVar148 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[7];
                  cVar28 = auVar30[7];
                  bVar150 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[8];
                  cVar28 = auVar30[8];
                  bVar152 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[9];
                  cVar28 = auVar30[9];
                  bVar154 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[10];
                  cVar28 = auVar30[10];
                  bVar156 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[0xb];
                  cVar28 = auVar30[0xb];
                  bVar158 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[0xc];
                  cVar28 = auVar30[0xc];
                  bVar160 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[0xd];
                  cVar28 = auVar30[0xd];
                  bVar162 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[0xe];
                  cVar28 = auVar30[0xe];
                  cVar34 = auVar30[0xf];
                  bVar164 = (cVar28 < cVar27) * cVar27 | (cVar28 >= cVar27) * cVar28;
                  cVar27 = auVar72[0xf];
                  bVar166 = (cVar34 < cVar27) * cVar27 | (cVar34 >= cVar27) * cVar34;
                  bVar7 = ((char)bVar135 < (char)bVar7) * bVar7 |
                          ((char)bVar135 >= (char)bVar7) * bVar135;
                  bVar102 = ((char)bVar138 < (char)bVar102) * bVar102 |
                            ((char)bVar138 >= (char)bVar102) * bVar138;
                  bVar103 = ((char)bVar140 < (char)bVar103) * bVar103 |
                            ((char)bVar140 >= (char)bVar103) * bVar140;
                  bVar104 = ((char)bVar142 < (char)bVar104) * bVar104 |
                            ((char)bVar142 >= (char)bVar104) * bVar142;
                  bVar105 = ((char)bVar144 < (char)bVar105) * bVar105 |
                            ((char)bVar144 >= (char)bVar105) * bVar144;
                  bVar106 = ((char)bVar146 < (char)bVar106) * bVar106 |
                            ((char)bVar146 >= (char)bVar106) * bVar146;
                  bVar107 = ((char)bVar148 < (char)bVar107) * bVar107 |
                            ((char)bVar148 >= (char)bVar107) * bVar148;
                  bVar108 = ((char)bVar150 < (char)bVar108) * bVar108 |
                            ((char)bVar150 >= (char)bVar108) * bVar150;
                  bVar109 = ((char)bVar152 < (char)bVar109) * bVar109 |
                            ((char)bVar152 >= (char)bVar109) * bVar152;
                  bVar110 = ((char)bVar154 < (char)bVar110) * bVar110 |
                            ((char)bVar154 >= (char)bVar110) * bVar154;
                  bVar111 = ((char)bVar156 < (char)bVar111) * bVar111 |
                            ((char)bVar156 >= (char)bVar111) * bVar156;
                  bVar112 = ((char)bVar158 < (char)bVar112) * bVar112 |
                            ((char)bVar158 >= (char)bVar112) * bVar158;
                  bVar113 = ((char)bVar160 < (char)bVar113) * bVar113 |
                            ((char)bVar160 >= (char)bVar113) * bVar160;
                  bVar114 = ((char)bVar162 < (char)bVar114) * bVar114 |
                            ((char)bVar162 >= (char)bVar114) * bVar162;
                  bVar115 = ((char)bVar164 < (char)bVar115) * bVar115 |
                            ((char)bVar164 >= (char)bVar115) * bVar164;
                  bVar116 = ((char)bVar166 < (char)bVar116) * bVar116 |
                            ((char)bVar166 >= (char)bVar116) * bVar166;
                  lVar14 = lVar14 + 0x10;
                } while (lVar12 != lVar14);
              } while (uVar21 != uVar16);
              uVar25 = ptr[uVar26][0];
              uVar16 = ptr[uVar26][1];
              uVar21 = b_03[uVar26][0];
              uVar82 = b_03[uVar26][1];
              uVar65 = b_04[uVar26][0];
              uVar77 = b_04[uVar26][1];
              uVar29 = b_05[uVar26][0];
              uVar50 = b_05[uVar26][1];
              if (iVar17 / (int)uVar24 < 0xf) {
                iVar20 = 1;
                if (1 < iVar9) {
                  iVar20 = iVar9;
                }
                do {
                  uVar16 = uVar16 << 8 | uVar25 >> 0x38;
                  uVar82 = uVar82 << 8 | uVar21 >> 0x38;
                  uVar77 = uVar77 << 8 | uVar65 >> 0x38;
                  uVar50 = uVar50 << 8 | uVar29 >> 0x38;
                  iVar20 = iVar20 + -1;
                  uVar25 = uVar25 << 8;
                  uVar21 = uVar21 << 8;
                  uVar65 = uVar65 << 8;
                  uVar29 = uVar29 << 8;
                } while (iVar20 != 0);
              }
              auVar67[0] = -((char)bVar176 < (char)local_138);
              auVar67[1] = -((char)bVar177 < (char)bStack_137);
              auVar67[2] = -((char)bVar178 < (char)bStack_136);
              auVar67[3] = -((char)bVar179 < (char)bStack_135);
              auVar67[4] = -((char)bVar180 < (char)bStack_134);
              auVar67[5] = -((char)bVar181 < (char)bStack_133);
              auVar67[6] = -((char)bVar182 < (char)bStack_132);
              auVar67[7] = -((char)bVar183 < (char)bStack_131);
              auVar67[8] = -((char)bVar184 < (char)bStack_130);
              auVar67[9] = -((char)bVar185 < (char)bStack_12f);
              auVar67[10] = -((char)bVar186 < (char)bStack_12e);
              auVar67[0xb] = -((char)bVar187 < (char)bStack_12d);
              auVar67[0xc] = -((char)bVar188 < (char)bStack_12c);
              auVar67[0xd] = -((char)bVar189 < (char)bStack_12b);
              auVar67[0xe] = -((char)bVar190 < (char)bStack_12a);
              auVar67[0xf] = -((char)bVar191 < (char)bStack_129);
              auVar66[0] = -((char)local_b8 < (char)bVar7);
              auVar66[1] = -((char)bStack_b7 < (char)bVar102);
              auVar66[2] = -((char)bStack_b6 < (char)bVar103);
              auVar66[3] = -((char)bStack_b5 < (char)bVar104);
              auVar66[4] = -((char)bStack_b4 < (char)bVar105);
              auVar66[5] = -((char)bStack_b3 < (char)bVar106);
              auVar66[6] = -((char)bStack_b2 < (char)bVar107);
              auVar66[7] = -((char)bStack_b1 < (char)bVar108);
              auVar66[8] = -((char)bStack_b0 < (char)bVar109);
              auVar66[9] = -((char)bStack_af < (char)bVar110);
              auVar66[10] = -((char)bStack_ae < (char)bVar111);
              auVar66[0xb] = -((char)bStack_ad < (char)bVar112);
              auVar66[0xc] = -((char)bStack_ac < (char)bVar113);
              auVar66[0xd] = -((char)bStack_ab < (char)bVar114);
              auVar66[0xe] = -((char)bStack_aa < (char)bVar115);
              auVar66[0xf] = -((char)bStack_a9 < (char)bVar116);
              auVar66 = auVar66 | auVar67;
              if ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar66 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar66 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar66 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar66 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar66 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar66 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar66 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar66 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar66 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar66 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar66 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar66[0xf]) {
                cVar27 = (char)(uVar16 >> 0x38);
                cVar28 = (char)(uVar82 >> 0x38);
                cVar34 = (char)(uVar77 >> 0x38);
                cVar35 = (char)(uVar50 >> 0x38);
              }
              else {
                *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                cVar27 = '\0';
                cVar28 = '\0';
                cVar34 = '\0';
                cVar35 = '\0';
                iVar8 = 0;
                iVar17 = 0;
              }
              ppVar11->score = (int)cVar27;
              ppVar11->end_query = iVar17;
              ppVar11->end_ref = iVar8;
              *(int *)(ppVar11->field_4).extra = (int)cVar28;
              ((ppVar11->field_4).stats)->similar = (int)cVar34;
              ((ppVar11->field_4).stats)->length = (int)cVar35;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar11;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile8.score;
    pvPm = (__m128i*)profile->profile8.matches;
    pvPs = (__m128i*)profile->profile8.similar;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi8(segLen), 1);
    vNegInfFront = _mm_insert_epi8(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi8(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi8(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi8(vGapper, vGapE);
            vGapperL = _mm_adds_epi8(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 1);
        vHpM = _mm_slli_si128(vHpM, 1);
        vHpS = _mm_slli_si128(vHpS, 1);
        vHpL = _mm_slli_si128(vHpL, 1);
        vHp = _mm_insert_epi8(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi8(vH, vGapO);
            vE_ext = _mm_subs_epi8(vE, vGapE);
            case1 = _mm_cmpgt_epi8(vE_opn, vE_ext);
            vE = _mm_max_epi8(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi8(vEL, vOne);
            vGapper = _mm_adds_epi8(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi8(vF, vGapper),
                    _mm_cmpeq_epi8(vF, vGapper));
            vF = _mm_max_epi8(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi8(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi8(vHp, vW);
            vHpM = _mm_adds_epi8(vHpM, vWM);
            vHpS = _mm_adds_epi8(vHpS, vWS);
            vHpL = _mm_adds_epi8(vHpL, vOne);
            case1 = _mm_cmpgt_epi8(vE, vHp);
            vHt = _mm_max_epi8(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 1);
        vHtM = _mm_slli_si128(vHtM, 1);
        vHtS = _mm_slli_si128(vHtS, 1);
        vHtL = _mm_slli_si128(vHtL, 1);
        vHt = _mm_insert_epi8(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi8(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi8(vGapper, vF),
                _mm_cmpeq_epi8(vGapper, vF));
        vF = _mm_max_epi8(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi8(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 1);
            __m128i vFtM = _mm_slli_si128(vFM, 1);
            __m128i vFtS = _mm_slli_si128(vFS, 1);
            __m128i vFtL = _mm_slli_si128(vFL, 1);
            vFt = _mm_adds_epi8(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi8(vFt, vF),
                    _mm_cmpeq_epi8(vFt, vF));
            vF = _mm_max_epi8(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi8(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 1);
        vFM = _mm_slli_si128(vFM, 1);
        vFS = _mm_slli_si128(vFS, 1);
        vFL = _mm_slli_si128(vFL, 1);
        vF = _mm_adds_epi8(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi8(vF, vHt);
        vH = _mm_max_epi8(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi8(vH, vGapO);
            vF_ext = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi8(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi8(vFL, vOne);
            vH = _mm_max_epi8(vHp, vE);
            vH = _mm_max_epi8(vH, vF);
            case1 = _mm_cmpeq_epi8(vH, vHp);
            case2 = _mm_cmpeq_epi8(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
                vHM = _mm_slli_si128(vHM, 1);
                vHS = _mm_slli_si128(vHS, 1);
                vHL = _mm_slli_si128(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
            result->stats->rowcols->matches_row[j] = (int8_t) _mm_extract_epi8 (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int8_t) _mm_extract_epi8 (vHS, 15);
            result->stats->rowcols->length_row[j] = (int8_t) _mm_extract_epi8 (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 1);
            vHM = _mm_slli_si128(vHM, 1);
            vHS = _mm_slli_si128(vHS, 1);
            vHL = _mm_slli_si128(vHL, 1);
        }
        score = (int8_t) _mm_extract_epi8 (vH, 15);
        matches = (int8_t) _mm_extract_epi8 (vHM, 15);
        similar = (int8_t) _mm_extract_epi8 (vHS, 15);
        length = (int8_t) _mm_extract_epi8 (vHL, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}